

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O2

bool __thiscall
UniValue::checkObject
          (UniValue *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>_>_>
          *t)

{
  bool bVar1;
  const_reference pvVar2;
  _Rb_tree_node_base *p_Var3;
  long in_FS_OFFSET;
  bool bVar4;
  size_t idx;
  size_t local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->typ == VOBJ) {
    for (p_Var3 = *(_Rb_tree_node_base **)(t + 0x18);
        bVar4 = p_Var3 == (_Rb_tree_node_base *)(t + 8), !bVar4;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      local_40 = 0;
      bVar1 = findKey(this,(string *)(p_Var3 + 1),&local_40);
      if (!bVar1) goto LAB_0017fe3c;
      pvVar2 = std::vector<UniValue,_std::allocator<UniValue>_>::at(&this->values,local_40);
      if (pvVar2->typ != p_Var3[2]._M_color) break;
    }
  }
  else {
LAB_0017fe3c:
    bVar4 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool UniValue::checkObject(const std::map<std::string,UniValue::VType>& t) const
{
    if (typ != VOBJ) {
        return false;
    }

    for (const auto& object: t) {
        size_t idx = 0;
        if (!findKey(object.first, idx)) {
            return false;
        }

        if (values.at(idx).getType() != object.second) {
            return false;
        }
    }

    return true;
}